

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O2

void tr_partition(saidx64_t *ISAd,saidx64_t *first,saidx64_t *middle,saidx64_t *last,saidx64_t **pa,
                 saidx64_t **pb,saidx64_t v)

{
  undefined8 uVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  
  do {
    plVar2 = middle;
    plVar8 = plVar2;
    if (last <= plVar2) goto LAB_00104a7a;
    middle = plVar2 + 1;
  } while (ISAd[*plVar2] == v);
  if (ISAd[*plVar2] < v) {
    while (plVar2 = plVar2 + 1, plVar2 < last) {
      lVar10 = *plVar2;
      if (v < ISAd[lVar10]) break;
      if (ISAd[lVar10] == v) {
        *plVar2 = *plVar8;
        *plVar8 = lVar10;
        plVar8 = plVar8 + 1;
      }
    }
  }
LAB_00104a7a:
  plVar4 = last + -1;
  do {
    plVar3 = plVar4;
    plVar5 = plVar3;
    if (plVar3 <= plVar2) goto LAB_00104b39;
    plVar4 = plVar3 + -1;
  } while (ISAd[*plVar3] == v);
  plVar4 = plVar3;
  if (v < ISAd[*plVar3]) {
    while (plVar5 = plVar4 + -1, plVar2 < plVar5) {
      lVar10 = *plVar5;
      if (ISAd[lVar10] < v) break;
      plVar4 = plVar5;
      if (ISAd[lVar10] == v) {
        *plVar5 = *plVar3;
        *plVar3 = lVar10;
        plVar3 = plVar3 + -1;
      }
    }
    plVar5 = plVar4 + -1;
  }
LAB_00104b39:
  do {
    if (plVar5 <= plVar2) {
      if (plVar8 <= plVar3) {
        lVar9 = (long)plVar8 - (long)first >> 3;
        lVar10 = (long)plVar2 - (long)plVar8 >> 3;
        if (lVar9 < lVar10) {
          lVar10 = lVar9;
        }
        lVar6 = 0;
        for (lVar9 = lVar10; 0 < lVar9; lVar9 = lVar9 + -1) {
          uVar1 = *(undefined8 *)((long)first + lVar6);
          *(undefined8 *)((long)first + lVar6) = *(undefined8 *)((long)plVar2 + lVar6 + lVar10 * -8)
          ;
          *(undefined8 *)((long)plVar2 + lVar6 + lVar10 * -8) = uVar1;
          lVar6 = lVar6 + 8;
        }
        lVar9 = (long)plVar3 + (8 - (long)plVar2) >> 3;
        lVar6 = (long)last - (long)plVar3 >> 3;
        lVar10 = lVar6 + -1;
        if (lVar9 < lVar6) {
          lVar10 = lVar9;
        }
        lVar7 = 0;
        for (lVar6 = lVar10; 0 < lVar6; lVar6 = lVar6 + -1) {
          uVar1 = *(undefined8 *)((long)plVar2 + lVar7);
          *(undefined8 *)((long)plVar2 + lVar7) = *(undefined8 *)((long)last + lVar7 + lVar10 * -8);
          *(undefined8 *)((long)last + lVar7 + lVar10 * -8) = uVar1;
          lVar7 = lVar7 + 8;
        }
        first = (saidx64_t *)((long)first + ((long)plVar2 - (long)plVar8));
        last = last + -lVar9;
      }
      *pa = first;
      *pb = last;
      return;
    }
    lVar10 = *plVar2;
    *plVar2 = *plVar5;
    *plVar5 = lVar10;
    while (plVar2 = plVar2 + 1, plVar2 < plVar5) {
      lVar10 = *plVar2;
      if (v < ISAd[lVar10]) break;
      if (ISAd[lVar10] == v) {
        *plVar2 = *plVar8;
        *plVar8 = lVar10;
        plVar8 = plVar8 + 1;
      }
    }
LAB_00104b27:
    plVar5 = plVar5 + -1;
  } while (plVar5 <= plVar2);
  lVar10 = *plVar5;
  if (ISAd[lVar10] < v) goto LAB_00104b39;
  if (ISAd[lVar10] == v) {
    *plVar5 = *plVar3;
    *plVar3 = lVar10;
    plVar3 = plVar3 + -1;
  }
  goto LAB_00104b27;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}